

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_text.cpp
# Opt level: O0

int __thiscall FFont::StringWidth(FFont *this,BYTE *string)

{
  int iVar1;
  bool bVar2;
  int local_20;
  int local_1c;
  int maxw;
  int w;
  BYTE *string_local;
  FFont *this_local;
  
  local_1c = 0;
  local_20 = 0;
  _maxw = string;
  while (*_maxw != 0) {
    if (*_maxw == 0x1c) {
      _maxw = _maxw + 1;
      if (*_maxw == 0x5b) {
        while( true ) {
          bVar2 = false;
          if (*_maxw != 0) {
            bVar2 = *_maxw != 0x5d;
          }
          if (!bVar2) break;
          _maxw = _maxw + 1;
        }
      }
      if (*_maxw != 0) {
        _maxw = _maxw + 1;
      }
    }
    else {
      if (*_maxw == 10) {
        if (local_20 < local_1c) {
          local_20 = local_1c;
        }
        local_1c = 0;
      }
      else {
        iVar1 = (*this->_vptr_FFont[3])(this,(ulong)*_maxw);
        local_1c = iVar1 + this->GlobalKerning + local_1c;
      }
      _maxw = _maxw + 1;
    }
  }
  iVar1 = MAX<int>(local_20,local_1c);
  return iVar1;
}

Assistant:

int FFont::StringWidth (const BYTE *string) const
{
	int w = 0;
	int maxw = 0;
		
	while (*string)
	{
		if (*string == TEXTCOLOR_ESCAPE)
		{
			++string;
			if (*string == '[')
			{
				while (*string != '\0' && *string != ']')
				{
					++string;
				}
			}
			if (*string != '\0')
			{
				++string;
			}
			continue;
		}
		else if (*string == '\n')
		{
			if (w > maxw)
				maxw = w;
			w = 0;
			++string;
		}
		else
		{
			w += GetCharWidth (*string++) + GlobalKerning;
		}
	}
				
	return MAX (maxw, w);
}